

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtilsSystemSpecific.cpp
# Opt level: O2

void ApprovalTests::FileUtilsSystemSpecific::copyFile(string *source,string *destination)

{
  bool isWindows;
  string cmd;
  string sStack_38;
  
  isWindows = SystemUtils::isWindowsOs();
  getCommandLineForCopy(&sStack_38,source,destination,isWindows);
  SystemUtils::runSystemCommandOrThrow(&sStack_38,false);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void FileUtilsSystemSpecific::copyFile(const std::string& source,
                                           const std::string& destination)
    {
        auto cmd = getCommandLineForCopy(source, destination, SystemUtils::isWindowsOs());
        SystemUtils::runSystemCommandOrThrow(cmd);
    }